

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall
kratos::InterfaceInstantiationVisitor::visit
          (InterfaceInstantiationVisitor *this,Generator *generator)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  InterfaceRef *pIVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_header *p_Var5;
  InterfaceRef *local_68;
  shared_ptr<kratos::Stmt> local_60;
  Generator *local_50;
  Generator *generator_local;
  shared_ptr<kratos::InterfaceInstantiationStmt> stmt;
  
  p_Var3 = (generator->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(generator->interfaces_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    local_50 = generator;
    do {
      pIVar2 = *(InterfaceRef **)(p_Var3 + 2);
      if ((pIVar2->has_instantiated_ == false) && (pIVar2->is_port_ == false)) {
        generator_local = (Generator *)0x0;
        local_68 = pIVar2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<kratos::InterfaceInstantiationStmt,std::allocator<kratos::InterfaceInstantiationStmt>,kratos::Generator*&,kratos::InterfaceRef*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt,
                   (InterfaceInstantiationStmt **)&generator_local,
                   (allocator<kratos::InterfaceInstantiationStmt> *)
                   ((long)&stmt.
                           super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7),&local_50,&local_68);
        std::__shared_ptr<kratos::InterfaceInstantiationStmt,(__gnu_cxx::_Lock_policy)2>::
        _M_enable_shared_from_this_with<kratos::InterfaceInstantiationStmt,kratos::InterfaceInstantiationStmt>
                  ((__shared_ptr<kratos::InterfaceInstantiationStmt,(__gnu_cxx::_Lock_policy)2> *)
                   &generator_local,(InterfaceInstantiationStmt *)generator_local);
        local_60.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)generator_local;
        local_60.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             stmt.super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        if (stmt.super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar1 = &((stmt.
                        super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar1 = &((stmt.
                        super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        Generator::add_stmt(local_50,&local_60);
        if ((element_type *)
            local_60.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        p_Var5 = &(generator_local->ports_)._M_t._M_impl.super__Rb_tree_header;
        while (p_Var5 = *(_Rb_tree_header **)&p_Var5->_M_header, p_Var5 != (_Rb_tree_header *)0x0) {
          (**(code **)(*(long *)(p_Var5->_M_header)._M_parent + 0x48))();
        }
        if (stmt.super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     stmt.
                     super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        const auto& interfaces = generator->interfaces();
        for (auto const& [name, interface] : interfaces) {
            if (interface->has_instantiated()) continue;
            if (interface->is_port()) continue;
            auto stmt = std::make_shared<InterfaceInstantiationStmt>(generator, interface.get());
            generator->add_stmt(stmt);

            // remove the stmts that's fold into the instantiation statement
            for (auto const& st : stmt->connection_stmt()) {
                st->remove_from_parent();
            }
        }
    }